

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::(anonymous_namespace)::WireType_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  Type field_type;
  AlphaNum *in_RCX;
  string_view pc;
  AlphaNum local_78;
  AlphaNum local_48;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  
  local_18 = (FieldDescriptor *)this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_48,"com.google.protobuf.WireFormat.FieldType.");
  field_type = FieldDescriptor::type(local_18);
  pc = FieldTypeName(field_type);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_78,pc);
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_48,&local_78,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string WireType(const FieldDescriptor* field) {
  return absl::StrCat("com.google.protobuf.WireFormat.FieldType.",
                      FieldTypeName(field->type()));
}